

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcd.c
# Opt level: O0

void trn_bcd(mdl_t *mdl)

{
  uint uVar1;
  seq_t *psVar2;
  uint64_t uVar3;
  bcd_t *pbVar4;
  bcd_t *pbVar5;
  uint32_t **__ptr;
  mdl_t *pmVar6;
  _Bool _Var7;
  void *pvVar8;
  double *pdVar9;
  uint32_t *puVar10;
  grd_st_t *pgVar11;
  long lVar12;
  undefined8 *puVar13;
  undefined8 uStackY_130;
  uint uStackY_128;
  undefined4 uStackY_124;
  size_t local_120;
  undefined8 *local_118;
  bcd_t *local_110;
  uint64_t o_7;
  seq_t *seq_2;
  uint local_f8;
  uint32_t id;
  uint32_t s_2;
  uint32_t yp;
  uint32_t d;
  uint32_t y;
  uint64_t o_6;
  bcd_t *pbStackY_d8;
  uint32_t i;
  bcd_t *bcd;
  uint64_t o_5;
  uint local_c0;
  uint32_t b_3;
  uint32_t b_2;
  uint32_t t_1;
  seq_t *seq_1;
  bcd_t *pbStackY_a8;
  uint32_t s_1;
  uint64_t o_4;
  uint64_t o_3;
  uint32_t **idx_lst;
  uint32_t *idx_cnt;
  uint64_t o_2;
  uint64_t o_1;
  uint local_70;
  uint32_t b_1;
  uint32_t b;
  uint32_t t;
  seq_t *seq;
  bcd_t *pbStack_58;
  uint32_t s;
  uint64_t o;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  long local_38;
  uint64_t tot;
  uint32_t local_28;
  uint32_t K;
  uint32_t T;
  uint32_t S;
  uint64_t O;
  mdl_t *pmStack_10;
  uint32_t Y;
  mdl_t *mdl_local;
  
  O._4_4_ = mdl->nlbl;
  _T = (bcd_t *)mdl->nobs;
  K = mdl->train->nseq;
  local_28 = mdl->train->mlen;
  tot._4_4_ = mdl->opt->maxiter;
  uStackY_124._3_1_ = 0;
  uStackY_130 = 0x105532;
  pmStack_10 = mdl;
  info("    - Build the index\n");
  uStackY_130 = 0x105544;
  info("        1/2 -- scan the sequences\n");
  local_38 = 0;
  __vla_expr0 = (unsigned_long)&uStackY_128;
  lVar12 = (long)&uStackY_128 - ((long)_T * 4 + 0xfU & 0xfffffffffffffff0);
  local_120 = lVar12;
  __vla_expr1 = (unsigned_long)_T;
  puVar13 = (undefined8 *)(lVar12 - ((long)_T * 4 + 0xfU & 0xfffffffffffffff0));
  local_118 = puVar13;
  o = (uint64_t)_T;
  for (pbStack_58 = (bcd_t *)0x0; pbStack_58 < _T;
      pbStack_58 = (bcd_t *)((long)&pbStack_58->ugrd + 1)) {
    *(undefined4 *)(lVar12 + (long)pbStack_58 * 4) = 0;
    *(undefined4 *)((long)puVar13 + (long)pbStack_58 * 4) = 0xffffffff;
  }
  for (seq._4_4_ = 0; seq._4_4_ < K; seq._4_4_ = seq._4_4_ + 1) {
    psVar2 = pmStack_10->train->seq[seq._4_4_];
    _b = psVar2;
    for (b_1 = 0; b_1 < psVar2->len; b_1 = b_1 + 1) {
      for (local_70 = 0; local_70 < *(uint *)&psVar2[(ulong)b_1 * 2 + 1].field_0x4;
          local_70 = local_70 + 1) {
        *(uint *)((long)puVar13 +
                 *(long *)(*(long *)(psVar2 + (ulong)b_1 * 2 + 2) + (ulong)local_70 * 8) * 4) =
             seq._4_4_;
      }
      for (o_1._4_4_ = 0; o_1._4_4_ < *(uint *)&psVar2[(ulong)b_1 * 2 + 1].raw;
          o_1._4_4_ = o_1._4_4_ + 1) {
        *(uint *)((long)puVar13 + psVar2[(ulong)b_1 * 2 + 2].raw[o_1._4_4_] * 4) = seq._4_4_;
      }
    }
    for (o_2 = 0; o_2 < _T; o_2 = o_2 + 1) {
      *(uint *)(lVar12 + o_2 * 4) =
           (uint)(*(uint *)((long)puVar13 + o_2 * 4) == seq._4_4_) + *(int *)(lVar12 + o_2 * 4);
    }
  }
  for (idx_cnt = (uint32_t *)0x0; idx_cnt < _T; idx_cnt = (uint32_t *)((long)idx_cnt + 1)) {
    local_38 = (ulong)*(uint *)(lVar12 + (long)idx_cnt * 4) + local_38;
  }
  puVar13[-1] = 0x105779;
  idx_lst = (uint32_t **)xmalloc(puVar13[1]);
  puVar13[-1] = 0x10578d;
  o_3 = (uint64_t)xmalloc(puVar13[1]);
  for (o_4 = 0; o_4 < _T; o_4 = o_4 + 1) {
    *(undefined4 *)((long)idx_lst + o_4 * 4) = *(undefined4 *)(local_120 + o_4 * 4);
    puVar13[-1] = 0x1057e3;
    pvVar8 = xmalloc(puVar13[1]);
    *(void **)(o_3 + o_4 * 8) = pvVar8;
  }
  puVar13[-1] = 0x10581a;
  info("        2/2 -- Populate the index\n");
  for (pbStackY_a8 = (bcd_t *)0x0; pbStackY_a8 < _T;
      pbStackY_a8 = (bcd_t *)((long)&pbStackY_a8->ugrd + 1)) {
    *(undefined4 *)(local_120 + (long)pbStackY_a8 * 4) = 0;
    *(undefined4 *)((long)local_118 + (long)pbStackY_a8 * 4) = 0xffffffff;
  }
  for (seq_1._4_4_ = 0; seq_1._4_4_ < K; seq_1._4_4_ = seq_1._4_4_ + 1) {
    psVar2 = pmStack_10->train->seq[seq_1._4_4_];
    _b_2 = psVar2;
    for (b_3 = 0; b_3 < psVar2->len; b_3 = b_3 + 1) {
      for (local_c0 = 0; local_c0 < *(uint *)&psVar2[(ulong)b_3 * 2 + 1].field_0x4;
          local_c0 = local_c0 + 1) {
        *(uint *)((long)local_118 +
                 *(long *)(*(long *)(psVar2 + (ulong)b_3 * 2 + 2) + (ulong)local_c0 * 8) * 4) =
             seq_1._4_4_;
      }
      for (o_5._4_4_ = 0; o_5._4_4_ < *(uint *)&psVar2[(ulong)b_3 * 2 + 1].raw;
          o_5._4_4_ = o_5._4_4_ + 1) {
        *(uint *)((long)local_118 + psVar2[(ulong)b_3 * 2 + 2].raw[o_5._4_4_] * 4) = seq_1._4_4_;
      }
    }
    for (bcd = (bcd_t *)0x0; bcd < _T; bcd = (bcd_t *)((long)&bcd->ugrd + 1)) {
      if (*(uint *)((long)local_118 + (long)bcd * 4) == seq_1._4_4_) {
        lVar12 = *(long *)(o_3 + (long)bcd * 8);
        uVar1 = *(uint *)(local_120 + (long)bcd * 4);
        *(uint *)(local_120 + (long)bcd * 4) = uVar1 + 1;
        *(uint *)(lVar12 + (ulong)uVar1 * 4) = seq_1._4_4_;
      }
    }
  }
  puVar13[-1] = 0x105a67;
  info("      Done\n");
  puVar13[-1] = 0x105a71;
  pbStackY_d8 = (bcd_t *)xmalloc(puVar13[1]);
  puVar13[-1] = 0x105a82;
  pdVar9 = xvm_new(puVar13[1]);
  pbStackY_d8->ugrd = pdVar9;
  puVar13[-1] = 0x105a99;
  pdVar9 = xvm_new(puVar13[1]);
  pbStackY_d8->uhes = pdVar9;
  puVar13[-1] = 0x105ab7;
  pdVar9 = xvm_new(puVar13[1]);
  pbStackY_d8->bgrd = pdVar9;
  puVar13[-1] = 0x105ad5;
  pdVar9 = xvm_new(puVar13[1]);
  pbStackY_d8->bhes = pdVar9;
  puVar13[-1] = 0x105af1;
  puVar10 = (uint32_t *)xmalloc(puVar13[1]);
  pbStackY_d8->actpos = puVar10;
  puVar13[-1] = 0x105b0c;
  pgVar11 = grd_stnew((mdl_t *)puVar13[1],(double *)*puVar13);
  pbStackY_d8->grd_st = pgVar11;
  for (o_6._4_4_ = 1; o_6._4_4_ <= tot._4_4_; o_6._4_4_ = o_6._4_4_ + 1) {
    for (_d = (bcd_t *)0x0; _d < _T; _d = (bcd_t *)((long)&_d->ugrd + 1)) {
      s_2 = 0;
      for (yp = 0; yp < O._4_4_; yp = yp + 1) {
        pbStackY_d8->ugrd[yp] = 0.0;
        pbStackY_d8->uhes[yp] = 0.0;
        for (id = 0; id < O._4_4_; id = id + 1) {
          pbStackY_d8->bgrd[s_2] = 0.0;
          pbStackY_d8->bhes[s_2] = 0.0;
          s_2 = s_2 + 1;
        }
      }
      for (local_f8 = 0; pmVar6 = pmStack_10, pbVar5 = pbStackY_d8, pbVar4 = _d,
          local_f8 < *(uint *)((long)idx_lst + (long)_d * 4); local_f8 = local_f8 + 1) {
        seq_2._4_4_ = *(uint *)(*(long *)(o_3 + (long)_d * 8) + (ulong)local_f8 * 4);
        psVar2 = pmStack_10->train->seq[seq_2._4_4_];
        o_7 = (uint64_t)psVar2;
        puVar13[-1] = 0x105ca3;
        bcd_actpos(pmVar6,pbVar5,psVar2,(uint64_t)pbVar4);
        puVar13[-1] = 0x105cbc;
        grd_stcheck((grd_st_t *)puVar13[1],*(uint32_t *)((long)puVar13 + 4));
        if ((pmStack_10->opt->sparse & 1U) == 0) {
          puVar13[-1] = 0x105d2e;
          grd_fldopsi((grd_st_t *)puVar13[0x13],(seq_t *)puVar13[0x12]);
          puVar13[-1] = 0x105d45;
          grd_flfwdbwd((grd_st_t *)puVar13[0x17],(seq_t *)puVar13[0x16]);
          puVar13[-1] = 0x105d63;
          bcd_flgradhes((mdl_t *)puVar13[0xb],(bcd_t *)puVar13[10],(seq_t *)puVar13[9],puVar13[8]);
        }
        else {
          puVar13[-1] = 0x105ce0;
          grd_spdopsi((grd_st_t *)puVar13[0x17],(seq_t *)puVar13[0x16]);
          uVar3 = o_7;
          pgVar11 = pbStackY_d8->grd_st;
          puVar13[-1] = 0x105cf7;
          grd_spfwdbwd(pgVar11,(seq_t *)uVar3);
          pmVar6 = pmStack_10;
          pbVar5 = pbStackY_d8;
          pbVar4 = _d;
          uVar3 = o_7;
          puVar13[-1] = 0x105d15;
          bcd_spgradhes(pmVar6,pbVar5,(seq_t *)uVar3,(uint64_t)pbVar4);
        }
      }
      puVar13[-1] = 0x105d90;
      bcd_update((mdl_t *)puVar13[0x17],(bcd_t *)puVar13[0x16],puVar13[0x15]);
    }
    puVar13[-1] = 0x105dbe;
    _Var7 = uit_progress((mdl_t *)puVar13[0xe],*(uint32_t *)((long)puVar13 + 0x6c),
                         (double)puVar13[0xc]);
    if (!_Var7) break;
  }
  puVar13[-1] = 0x105dea;
  grd_stfree((grd_st_t *)puVar13[-1]);
  puVar13[-1] = 0x105df9;
  xvm_free((double *)*puVar13);
  puVar13[-1] = 0x105e09;
  xvm_free((double *)*puVar13);
  puVar13[-1] = 0x105e19;
  xvm_free((double *)*puVar13);
  puVar13[-1] = 0x105e29;
  xvm_free((double *)*puVar13);
  puVar10 = pbStackY_d8->actpos;
  puVar13[-1] = 0x105e39;
  free(puVar10);
  pbVar4 = pbStackY_d8;
  puVar13[-1] = 0x105e45;
  free(pbVar4);
  for (local_110 = (bcd_t *)0x0; uVar3 = o_3, local_110 < _T;
      local_110 = (bcd_t *)((long)&local_110->ugrd + 1)) {
    pvVar8 = *(void **)(o_3 + (long)local_110 * 8);
    puVar13[-1] = 0x105e74;
    free(pvVar8);
  }
  puVar13[-1] = 0x105e94;
  free((void *)uVar3);
  __ptr = idx_lst;
  puVar13[-1] = 0x105ea0;
  free(__ptr);
  return;
}

Assistant:

void trn_bcd(mdl_t *mdl) {
	const uint32_t Y = mdl->nlbl;
	const uint64_t O = mdl->nobs;
	const uint32_t S = mdl->train->nseq;
	const uint32_t T = mdl->train->mlen;
	const uint32_t K = mdl->opt->maxiter;
	// Build the index:
	//   Count active sequences per blocks
	info("    - Build the index\n");
	info("        1/2 -- scan the sequences\n");
	uint64_t tot = 0;
	uint32_t cnt[O], lcl[O];
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Updates blocks count
		for (uint64_t o = 0; o < O; o++)
			cnt[o] += (lcl[o] == s);
	}
	for (uint64_t o = 0; o < O; o++)
		tot += cnt[o];
	// Allocate memory
	uint32_t  *idx_cnt = xmalloc(sizeof(uint32_t  ) * O);
	uint32_t **idx_lst = xmalloc(sizeof(uint32_t *) * O);
	for (uint64_t o = 0; o < O; o++) {
		idx_cnt[o] = cnt[o];
		idx_lst[o] = xmalloc(sizeof(uint32_t) * cnt[o]);
	}
	// Populate the index
	info("        2/2 -- Populate the index\n");
	for (uint64_t o = 0; o < O; o++)
		cnt[o] = 0, lcl[o] = (uint32_t)-1;
	for (uint32_t s = 0; s < S; s++) {
		// List actives blocks
		const seq_t *seq = mdl->train->seq[s];
		for (uint32_t t = 0; t < seq->len; t++) {
			for (uint32_t b = 0; b < seq->pos[t].ucnt; b++)
				lcl[seq->pos[t].uobs[b]] = s;
			for (uint32_t b = 0; b < seq->pos[t].bcnt; b++)
				lcl[seq->pos[t].bobs[b]] = s;
		}
		// Build index
		for (uint64_t o = 0; o < O; o++)
			if (lcl[o] == s)
				idx_lst[o][cnt[o]++] = s;
	}
	info("      Done\n");
	// Allocate the specific trainer of BCD
	bcd_t *bcd = xmalloc(sizeof(bcd_t));
	bcd->ugrd   = xvm_new(Y);
	bcd->uhes   = xvm_new(Y);
	bcd->bgrd   = xvm_new(Y * Y);
	bcd->bhes   = xvm_new(Y * Y);
	bcd->actpos = xmalloc(sizeof(int) * T);
	bcd->grd_st = grd_stnew(mdl, NULL);
	// And train the model
	for (uint32_t i = 1; i <= K; i++) {
		for (uint64_t o = 0; o < O; o++) {
			// Clear the gradient and the hessian
			for (uint32_t y = 0, d = 0; y < Y; y++) {
				bcd->ugrd[y] = 0.0;
				bcd->uhes[y] = 0.0;
				for (uint32_t yp = 0; yp < Y; yp++, d++) {
					bcd->bgrd[d] = 0.0;
					bcd->bhes[d] = 0.0;
				}
			}
			// Process active sequences
			for (uint32_t s = 0; s < idx_cnt[o]; s++) {
				const uint32_t id = idx_lst[o][s];
				const seq_t *seq = mdl->train->seq[id];
				bcd_actpos(mdl, bcd, seq, o);
				grd_stcheck(bcd->grd_st, seq->len);
				if (mdl->opt->sparse) {
					grd_spdopsi(bcd->grd_st, seq);
					grd_spfwdbwd(bcd->grd_st, seq);
					bcd_spgradhes(mdl, bcd, seq, o);
				} else {
					grd_fldopsi(bcd->grd_st, seq);
					grd_flfwdbwd(bcd->grd_st, seq);
					bcd_flgradhes(mdl, bcd, seq, o);
				}
			}
			// And update the model
			bcd_update(mdl, bcd, o);
		}
		if (!uit_progress(mdl, i, -1.0))
			break;
	}
	// Cleanup memory
	grd_stfree(bcd->grd_st);
	xvm_free(bcd->ugrd); xvm_free(bcd->uhes);
	xvm_free(bcd->bgrd); xvm_free(bcd->bhes);
	free(bcd->actpos);
	free(bcd);
	for (uint64_t o = 0; o < O; o++)
		free(idx_lst[o]);
	free(idx_lst);
	free(idx_cnt);
}